

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O2

bool __thiscall CppJieba::Trie::_insert(Trie *this,TrieNodeInfo *nodeInfo)

{
  pointer puVar1;
  iterator iVar2;
  mapped_type *ppTVar3;
  mapped_type pTVar4;
  uint uVar5;
  mapped_type this_00;
  allocator local_51;
  uint16_t cu;
  
  if (this->_initFlag == false) {
    std::__cxx11::string::string((string *)&cu,"not initted!",&local_51);
    Limonp::Logger::LoggingF(4,"Trie.hpp",0x108,(string *)&cu);
  }
  else {
    uVar5 = 0;
    this_00 = this->_root;
    while( true ) {
      puVar1 = (nodeInfo->word).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(nodeInfo->word).
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1 >> 1) <= (ulong)uVar5)
      break;
      cu = puVar1[uVar5];
      if (this_00 == (mapped_type)0x0) {
        return false;
      }
      iVar2 = std::
              _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)this_00,&cu);
      if (iVar2.
          super__Node_iterator_base<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_false>.
          _M_cur == (__node_type *)0x0) {
        pTVar4 = (mapped_type)operator_new(0x40);
        (pTVar4->hmap)._M_h._M_buckets = &(pTVar4->hmap)._M_h._M_single_bucket;
        (pTVar4->hmap)._M_h._M_bucket_count = 1;
        (pTVar4->hmap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        (pTVar4->hmap)._M_h._M_element_count = 0;
        (pTVar4->hmap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        pTVar4->nodeInfoVecPos = 0;
        (pTVar4->hmap)._M_h._M_rehash_policy._M_next_resize = 0;
        (pTVar4->hmap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
        pTVar4->isLeaf = false;
        ppTVar3 = std::__detail::
                  _Map_base<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_00,&cu);
        *ppTVar3 = pTVar4;
      }
      else {
        ppTVar3 = std::__detail::
                  _Map_base<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_00,&cu);
        pTVar4 = *ppTVar3;
      }
      uVar5 = uVar5 + 1;
      this_00 = pTVar4;
    }
    if (this_00 == (mapped_type)0x0) {
      return false;
    }
    if (this_00->isLeaf != true) {
      this_00->isLeaf = true;
      std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::push_back
                (&this->_nodeInfoVec,nodeInfo);
      this_00->nodeInfoVecPos =
           (int)(((long)(this->_nodeInfoVec).
                        super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->_nodeInfoVec).
                       super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x48) - 1;
      return true;
    }
    std::__cxx11::string::string((string *)&cu,"this node already _inserted",&local_51);
    Limonp::Logger::LoggingF(3,"Trie.hpp",0x12f,(string *)&cu);
  }
  std::__cxx11::string::~string((string *)&cu);
  return false;
}

Assistant:

bool _insert(const TrieNodeInfo& nodeInfo)
            {
                if(!_getInitFlag())
                {
                    LogFatal("not initted!");
                    return false;
                }


                const Unicode& uintVec = nodeInfo.word;
                TrieNode* p = _root;
                for(uint i = 0; i < uintVec.size(); i++)
                {
                    uint16_t cu = uintVec[i];
                    if(NULL == p)
                    {
                        return false;
                    }
                    if(p->hmap.end() == p->hmap.find(cu))
                    {
                        TrieNode * next = NULL;
                        try
                        {
                            next = new TrieNode;
                        }
                        catch(const bad_alloc& e)
                        {
                            return false;
                        }
                        p->hmap[cu] = next;
                        p = next;
                    }
                    else
                    {
                        p = p->hmap[cu];
                    }
                }
                if(NULL == p)
                {
                    return false;
                }
                if(p->isLeaf)
                {
                    LogError("this node already _inserted");
                    return false;
                }

                p->isLeaf = true;
                _nodeInfoVec.push_back(nodeInfo);
                p->nodeInfoVecPos = _nodeInfoVec.size() - 1;

                return true;
            }